

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

TSNode * ts_node__prev_sibling(TSNode *__return_storage_ptr__,TSNode self,_Bool include_anonymous)

{
  ulong uVar1;
  undefined8 uVar2;
  TSNode self_00;
  TSNode self_01;
  bool bVar3;
  bool bVar4;
  _Bool _Var5;
  uint32_t *puVar6;
  uint uVar7;
  Length LVar8;
  TSNode child;
  NodeChildIterator iterator;
  TSTree *local_108;
  ulong *local_100;
  TSTree *local_f8;
  ulong *local_f0;
  undefined1 local_d8 [16];
  ulong *local_c8;
  TSTree *pTStack_c0;
  uint32_t local_b8 [2];
  TSTree *pTStack_b0;
  uint32_t local_a8 [2];
  TSTree *pTStack_a0;
  long local_98;
  Subtree self_02;
  uint32_t uVar9;
  uint32_t uVar10;
  undefined8 in_stack_ffffffffffffff80;
  TSTree *in_stack_ffffffffffffff88;
  ulong *local_70;
  TSTree *pTStack_68;
  NodeChildIterator local_60;
  
  self_02 = *self.id;
  LVar8 = ts_subtree_total_size(self_02);
  uVar9 = LVar8.bytes;
  uVar10 = LVar8.extent.row;
  LVar8 = ts_subtree_size(self_02);
  uVar7 = LVar8.bytes + self.context[0];
  self_01.context[2] = uVar9;
  self_01.context._0_8_ = self_02.ptr;
  self_01.context[3] = uVar10;
  self_01.id = (void *)in_stack_ffffffffffffff80;
  self_01.tree = in_stack_ffffffffffffff88;
  ts_node_parent(self_01);
  local_a8[0] = 0;
  local_a8[1] = 0;
  pTStack_a0 = (TSTree *)0x0;
  local_98 = (ulong)!include_anonymous * 4 + 0x38;
  local_f0 = (ulong *)0x0;
  local_f8 = (TSTree *)0x0;
  bVar3 = false;
LAB_00112e39:
  do {
    if (local_c8 == (ulong *)0x0) {
      __return_storage_ptr__->id = (void *)0x0;
      __return_storage_ptr__->tree = (TSTree *)0x0;
      __return_storage_ptr__->context[0] = 0;
      __return_storage_ptr__->context[1] = 0;
      __return_storage_ptr__->context[2] = 0;
      __return_storage_ptr__->context[3] = 0;
      return __return_storage_ptr__;
    }
    local_b8[0] = 0;
    local_b8[1] = 0;
    pTStack_b0 = (TSTree *)0x0;
    ts_node_iterate_children((TSNode *)local_d8);
    local_100 = (ulong *)0x0;
    local_108 = (TSTree *)0x0;
    bVar4 = false;
LAB_00112e77:
    _Var5 = ts_node_child_iterator_next(&local_60,(TSNode *)&stack0xffffffffffffff80);
    if ((_Var5) && (local_70 != (ulong *)self.id)) {
      if ((local_60.position.bytes <= uVar7) &&
         ((local_60.position.bytes != uVar7 ||
          ((uVar9 == 0 &&
           (_Var5 = ts_subtree_has_trailing_empty_descendant((SubtreeHeapData *)*local_70,self_02),
           !_Var5)))))) {
        self_00.context._8_8_ = in_stack_ffffffffffffff88;
        self_00.context[0] = (uint32_t)in_stack_ffffffffffffff80;
        self_00.context[1] = SUB84(in_stack_ffffffffffffff80,4);
        self_00.id = local_70;
        self_00.tree = pTStack_68;
        _Var5 = ts_node__is_relevant(self_00,include_anonymous);
        if (!_Var5) break;
        bVar4 = true;
        goto LAB_00112f2c;
      }
      local_d8._8_8_ = in_stack_ffffffffffffff88;
      local_d8._0_8_ = in_stack_ffffffffffffff80;
      if (local_100 != (ulong *)0x0) {
        local_a8[0] = local_b8[0];
        local_a8[1] = local_b8[1];
        pTStack_a0 = pTStack_b0;
        local_f0 = local_100;
        local_f8 = local_108;
        bVar3 = bVar4;
      }
      local_c8 = local_70;
      pTStack_c0 = pTStack_68;
      in_stack_ffffffffffffff80 = local_d8._0_8_;
      in_stack_ffffffffffffff88 = (TSTree *)local_d8._8_8_;
      goto LAB_00112e39;
    }
    if (bVar4) {
      puVar6 = local_b8;
      local_f0 = local_100;
      local_f8 = local_108;
LAB_0011303e:
      uVar2 = *(undefined8 *)(puVar6 + 2);
      *(undefined8 *)__return_storage_ptr__->context = *(undefined8 *)puVar6;
      *(undefined8 *)(__return_storage_ptr__->context + 2) = uVar2;
      __return_storage_ptr__->id = local_f0;
      __return_storage_ptr__->tree = local_f8;
      return __return_storage_ptr__;
    }
    if (local_100 == (ulong *)0x0) {
      if (bVar3) {
        puVar6 = local_a8;
        goto LAB_0011303e;
      }
      local_d8._0_4_ = local_a8[0];
      local_d8._4_4_ = local_a8[1];
      local_d8._8_8_ = pTStack_a0;
      local_c8 = local_f0;
      pTStack_c0 = local_f8;
    }
    else {
      local_d8._0_4_ = local_b8[0];
      local_d8._4_4_ = local_b8[1];
      local_d8._8_8_ = pTStack_b0;
      local_c8 = local_100;
      pTStack_c0 = local_108;
    }
  } while( true );
  uVar1 = *local_70;
  if ((((uVar1 & 1) == 0) && (*(int *)(uVar1 + 0x24) != 0)) && (*(int *)(uVar1 + local_98) != 0)) {
    bVar4 = false;
LAB_00112f2c:
    local_108 = pTStack_68;
    local_100 = local_70;
    local_b8 = (uint32_t  [2])in_stack_ffffffffffffff80;
    pTStack_b0 = in_stack_ffffffffffffff88;
  }
  goto LAB_00112e77;
}

Assistant:

static inline TSNode ts_node__prev_sibling(TSNode self, bool include_anonymous) {
  Subtree self_subtree = ts_node__subtree(self);
  bool self_is_empty = ts_subtree_total_bytes(self_subtree) == 0;
  uint32_t target_end_byte = ts_node_end_byte(self);

  TSNode node = ts_node_parent(self);
  TSNode earlier_node = ts_node__null();
  bool earlier_node_is_relevant = false;

  while (!ts_node_is_null(node)) {
    TSNode earlier_child = ts_node__null();
    bool earlier_child_is_relevant = false;
    bool found_child_containing_target = false;

    TSNode child;
    NodeChildIterator iterator = ts_node_iterate_children(&node);
    while (ts_node_child_iterator_next(&iterator, &child)) {
      if (child.id == self.id) break;
      if (iterator.position.bytes > target_end_byte) {
        found_child_containing_target = true;
        break;
      }

      if (iterator.position.bytes == target_end_byte &&
          (!self_is_empty ||
           ts_subtree_has_trailing_empty_descendant(ts_node__subtree(child), self_subtree))) {
        found_child_containing_target = true;
        break;
      }

      if (ts_node__is_relevant(child, include_anonymous)) {
        earlier_child = child;
        earlier_child_is_relevant = true;
      } else if (ts_node__relevant_child_count(child, include_anonymous) > 0) {
        earlier_child = child;
        earlier_child_is_relevant = false;
      }
    }

    if (found_child_containing_target) {
      if (!ts_node_is_null(earlier_child)) {
        earlier_node = earlier_child;
        earlier_node_is_relevant = earlier_child_is_relevant;
      }
      node = child;
    } else if (earlier_child_is_relevant) {
      return earlier_child;
    } else if (!ts_node_is_null(earlier_child)) {
      node = earlier_child;
    } else if (earlier_node_is_relevant) {
      return earlier_node;
    } else {
      node = earlier_node;
    }
  }

  return ts_node__null();
}